

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_methodDictionary_createWithCapacity(sysbvm_context_t *context,size_t initialCapacity)

{
  ulong uVar1;
  sysbvm_object_tuple_t *psVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  size_t local_38;
  size_t i;
  size_t entryCount;
  sysbvm_methodDictionary_t *result;
  size_t requiredStorageCapacity;
  size_t initialCapacity_local;
  sysbvm_context_t *context_local;
  
  uVar1 = (initialCapacity * 0x82) / 100;
  psVar2 = sysbvm_context_allocatePointerTuple(context,(context->roots).methodDictionaryType,2);
  sVar3 = sysbvm_tuple_size_encode(context,0);
  (psVar2->field_1).pointers[0] = sVar3;
  if (uVar1 != 0) {
    sVar3 = uVar1 << 1;
    sVar4 = sysbvm_array_create(context,sVar3);
    psVar2[1].header.field_0.typePointer = sVar4;
    for (local_38 = 0; local_38 < sVar3; local_38 = local_38 + 1) {
      sysbvm_array_atPut(psVar2[1].header.field_0.typePointer,local_38,0x3f);
    }
  }
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_methodDictionary_createWithCapacity(sysbvm_context_t *context, size_t initialCapacity)
{
    size_t requiredStorageCapacity = initialCapacity * 130 / 100;
    sysbvm_methodDictionary_t *result = (sysbvm_methodDictionary_t*)sysbvm_context_allocatePointerTuple(context, context->roots.methodDictionaryType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_methodDictionary_t));
    result->size = sysbvm_tuple_size_encode(context, 0);
    if(requiredStorageCapacity > 0)
    {
        size_t entryCount = requiredStorageCapacity * 2;
        result->storage = sysbvm_array_create(context, entryCount);
        for(size_t i = 0; i < entryCount; ++i)
            sysbvm_array_atPut(result->storage, i, SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE);
    }

    return (sysbvm_tuple_t)result;
}